

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O1

void multikey_simd_b<unsigned_char>
               (uchar **strings,size_t N,size_t depth,uchar **sorted,uint8_t *oracle)

{
  byte *pbVar1;
  uchar *puVar2;
  long lVar3;
  uchar *puVar4;
  int iVar5;
  size_t sVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  uchar **ppuVar10;
  ulong uVar11;
  uchar **ppuVar12;
  long lVar13;
  size_t sVar14;
  byte bVar15;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  undefined1 auVar16 [16];
  uchar data00 [16];
  byte local_98 [8];
  undefined8 uStack_90;
  long local_88;
  undefined1 local_78 [16];
  ulong local_68;
  ulong local_60;
  size_t local_58;
  size_t local_50;
  undefined1 local_48 [16];
  
  local_48 = ZEXT416(0x80);
  while (0x1f < N) {
    bVar7 = pseudo_median<unsigned_char>(strings,N,depth);
    local_78 = (undefined1  [16])0x0;
    local_68 = 0;
    uVar8 = N & 0xfffffffffffffff0;
    if (uVar8 != 0) {
      auVar16[0] = bVar7 + local_48[0];
      auVar16._8_8_ =
           (undefined8)
           (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(local_48[7],local_48[7]),
                                                                  local_48[6]),local_48[6]),
                                                local_48[5]),local_48[5]),local_48[4]),
                     CONCAT11(local_48[4],local_48[7])) >> 8);
      auVar16[7] = local_48[3];
      auVar16[6] = local_48[3];
      auVar16[5] = local_48[2];
      auVar16[4] = local_48[2];
      auVar16[3] = local_48[1];
      auVar16[2] = local_48[1];
      auVar16[1] = auVar16[0];
      auVar16 = pshuflw(auVar16,auVar16,0);
      uVar11 = 0;
      ppuVar10 = strings;
      do {
        lVar13 = 0;
        do {
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x10);
        lVar13 = 0;
        do {
          local_98[lVar13] = ppuVar10[lVar13][depth];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x10);
        bVar15 = auVar16[0];
        bVar17 = auVar16[1];
        bVar18 = auVar16[2];
        bVar19 = auVar16[3];
        pbVar1 = oracle + uVar11;
        *pbVar1 = -((char)bVar15 < (char)(local_98[0] ^ 0x80)) & 2U |
                  -((local_98[0] ^ 0x80) == bVar15) & 1U;
        pbVar1[1] = -((char)bVar17 < (char)(local_98[1] ^ 0x80)) & 2U |
                    -((local_98[1] ^ 0x80) == bVar17) & 1U;
        pbVar1[2] = -((char)bVar18 < (char)(local_98[2] ^ 0x80)) & 2U |
                    -((local_98[2] ^ 0x80) == bVar18) & 1U;
        pbVar1[3] = -((char)bVar19 < (char)(local_98[3] ^ 0x80)) & 2U |
                    -((local_98[3] ^ 0x80) == bVar19) & 1U;
        pbVar1[4] = -((char)bVar15 < (char)(local_98[4] ^ 0x80)) & 2U |
                    -((local_98[4] ^ 0x80) == bVar15) & 1U;
        pbVar1[5] = -((char)bVar17 < (char)(local_98[5] ^ 0x80)) & 2U |
                    -((local_98[5] ^ 0x80) == bVar17) & 1U;
        pbVar1[6] = -((char)bVar18 < (char)(local_98[6] ^ 0x80)) & 2U |
                    -((local_98[6] ^ 0x80) == bVar18) & 1U;
        pbVar1[7] = -((char)bVar19 < (char)(local_98[7] ^ 0x80)) & 2U |
                    -((local_98[7] ^ 0x80) == bVar19) & 1U;
        pbVar1[8] = -((char)bVar15 < (char)((byte)uStack_90 ^ 0x80)) & 2U |
                    -(((byte)uStack_90 ^ 0x80) == bVar15) & 1U;
        pbVar1[9] = -((char)bVar17 < (char)(uStack_90._1_1_ ^ 0x80)) & 2U |
                    -((uStack_90._1_1_ ^ 0x80) == bVar17) & 1U;
        pbVar1[10] = -((char)bVar18 < (char)(uStack_90._2_1_ ^ 0x80)) & 2U |
                     -((uStack_90._2_1_ ^ 0x80) == bVar18) & 1U;
        pbVar1[0xb] = -((char)bVar19 < (char)(uStack_90._3_1_ ^ 0x80)) & 2U |
                      -((uStack_90._3_1_ ^ 0x80) == bVar19) & 1U;
        pbVar1[0xc] = -((char)bVar15 < (char)(uStack_90._4_1_ ^ 0x80)) & 2U |
                      -((uStack_90._4_1_ ^ 0x80) == bVar15) & 1U;
        pbVar1[0xd] = -((char)bVar17 < (char)(uStack_90._5_1_ ^ 0x80)) & 2U |
                      -((uStack_90._5_1_ ^ 0x80) == bVar17) & 1U;
        pbVar1[0xe] = -((char)bVar18 < (char)(uStack_90._6_1_ ^ 0x80)) & 2U |
                      -((uStack_90._6_1_ ^ 0x80) == bVar18) & 1U;
        pbVar1[0xf] = -((char)bVar19 < (char)(uStack_90._7_1_ ^ 0x80)) & 2U |
                      -((uStack_90._7_1_ ^ 0x80) == bVar19) & 1U;
        uVar11 = uVar11 + 0x10;
        ppuVar10 = ppuVar10 + 0x10;
      } while (uVar11 < uVar8);
    }
    if (uVar8 != N) {
      do {
        if (strings[uVar8] == (uchar *)0x0) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x26,"unsigned char get_char(unsigned char *, size_t)");
        }
        bVar15 = strings[uVar8][depth];
        oracle[uVar8] = (bVar7 <= bVar15 && bVar15 != bVar7) * '\x02' | bVar15 == bVar7;
        uVar8 = uVar8 + 1;
      } while (uVar8 < N);
    }
    lVar9 = N + (N == 0);
    lVar13 = 0;
    do {
      *(long *)(local_78 + (ulong)oracle[lVar13] * 8) =
           *(long *)(local_78 + (ulong)oracle[lVar13] * 8) + 1;
      lVar13 = lVar13 + 1;
    } while (lVar9 != lVar13);
    local_50 = local_78._8_8_;
    if (local_78._8_8_ + local_78._0_8_ + local_68 != N) {
      __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                    ,0x166,
                    "void multikey_simd_b(unsigned char **, size_t, size_t, unsigned char **__restrict, uint8_t *__restrict) [CharT = unsigned char]"
                   );
    }
    local_60 = local_68;
    local_98[0] = 0;
    local_98[1] = 0;
    local_98[2] = 0;
    local_98[3] = 0;
    local_98[4] = 0;
    local_98[5] = 0;
    local_98[6] = 0;
    local_98[7] = 0;
    local_58 = local_78._0_8_;
    uStack_90 = local_78._0_8_;
    local_88 = local_78._8_8_ + local_78._0_8_;
    lVar13 = 0;
    do {
      puVar2 = strings[lVar13];
      pbVar1 = oracle + lVar13;
      lVar13 = lVar13 + 1;
      lVar3 = *(long *)(local_98 + (ulong)*pbVar1 * 8);
      *(long *)(local_98 + (ulong)*pbVar1 * 8) = lVar3 + 1;
      sorted[lVar3] = puVar2;
    } while (lVar9 != lVar13);
    memcpy(strings,sorted,N << 3);
    sVar14 = local_58;
    multikey_simd_b<unsigned_char>(strings,local_58,depth,sorted,oracle);
    sVar6 = local_50;
    if (bVar7 != 0) {
      multikey_simd_b<unsigned_char>(strings + sVar14,local_50,depth + 1,sorted,oracle);
    }
    strings = strings + sVar14 + sVar6;
    N = local_60;
  }
  ppuVar10 = strings;
  if (1 < (long)N) {
    do {
      iVar5 = (int)N;
      N = (size_t)(iVar5 - 1);
      puVar2 = ppuVar10[1];
      for (ppuVar12 = ppuVar10 + 1; strings < ppuVar12; ppuVar12 = ppuVar12 + -1) {
        puVar4 = ppuVar12[-1];
        bVar7 = puVar4[depth];
        bVar15 = puVar2[depth];
        if ((bVar7 != 0) && (sVar14 = depth + 1, bVar7 == bVar15)) {
          do {
            bVar7 = puVar4[sVar14];
            bVar15 = puVar2[sVar14];
            if (bVar7 == 0) break;
            sVar14 = sVar14 + 1;
          } while (bVar7 == bVar15);
        }
        if (bVar7 <= bVar15) break;
        *ppuVar12 = puVar4;
      }
      *ppuVar12 = puVar2;
      ppuVar10 = ppuVar10 + 1;
    } while (2 < iVar5);
  }
  return;
}

Assistant:

static void
multikey_simd_b(unsigned char** strings, size_t N, size_t depth,
		unsigned char** restrict sorted, uint8_t* restrict oracle)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<true>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		++bucketsize[oracle[i]];
	}
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	multikey_simd_b<CharT>(strings, bucketsize[0], depth,
			sorted, oracle);
	if (not is_end(partval))
		multikey_simd_b<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT),
				sorted, oracle);
	multikey_simd_b<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth, sorted, oracle);
}